

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O1

ON_SubDComponentPtr __thiscall
ON_SubDComponentIterator::NextComponent(ON_SubDComponentIterator *this)

{
  ON_SubDComponentPtr *this_00;
  bool bVar1;
  Type TVar2;
  undefined7 extraout_var;
  ON_SubDComponentPtr OVar3;
  ON_SubDEdge *pOVar4;
  ON_SubDFace *pOVar5;
  
  this_00 = &this->m_cptr_current;
  TVar2 = ON_SubDComponentPtr::ComponentType(this_00);
  OVar3.m_ptr = CONCAT71(extraout_var,TVar2);
  if (TVar2 != Face) {
    if (TVar2 != Edge) {
      if (TVar2 != Vertex) goto LAB_00623bc7;
      bVar1 = true;
      OVar3.m_ptr = (this->m_cptr_current).m_ptr & 0xfffffffffffffff8;
      if ((((ON_SubDVertex *)OVar3.m_ptr != (ON_SubDVertex *)0x0) &&
          (this->m_vertex_last != (ON_SubDVertex *)OVar3.m_ptr)) &&
         (((ON_SubDVertex *)OVar3.m_ptr)->m_next_vertex != (ON_SubDVertex *)0x0)) {
        OVar3 = ON_SubDComponentPtr::Create(((ON_SubDVertex *)OVar3.m_ptr)->m_next_vertex);
        this_00->m_ptr = OVar3.m_ptr;
        bVar1 = false;
      }
      if (!bVar1) {
        return (ON_SubDComponentPtr)OVar3.m_ptr;
      }
      this_00->m_ptr = 0;
    }
    if ((this_00->m_ptr == 0) && (this->m_edge_first != (ON_SubDEdge *)0x0)) {
      OVar3 = ON_SubDComponentPtr::Create(this->m_edge_first);
      goto LAB_00623bee;
    }
    bVar1 = true;
    pOVar4 = (ON_SubDEdge *)(this_00->m_ptr & 0xfffffffffffffff8);
    if ((pOVar4 != (ON_SubDEdge *)0x0) &&
       ((this->m_edge_last != pOVar4 && (pOVar4->m_next_edge != (ON_SubDEdge *)0x0)))) {
      OVar3 = ON_SubDComponentPtr::Create(pOVar4->m_next_edge);
      this_00->m_ptr = OVar3.m_ptr;
      bVar1 = false;
    }
    if (!bVar1) {
      return (ON_SubDComponentPtr)OVar3.m_ptr;
    }
    this_00->m_ptr = 0;
  }
  if ((this_00->m_ptr != 0) || (this->m_face_first == (ON_SubDFace *)0x0)) {
    bVar1 = true;
    pOVar5 = (ON_SubDFace *)(this_00->m_ptr & 0xfffffffffffffff8);
    if (((pOVar5 != (ON_SubDFace *)0x0) && (this->m_face_last != pOVar5)) &&
       (pOVar5->m_next_face != (ON_SubDFace *)0x0)) {
      OVar3 = ON_SubDComponentPtr::Create(pOVar5->m_next_face);
      this_00->m_ptr = OVar3.m_ptr;
      bVar1 = false;
    }
    if (!bVar1) {
      return (ON_SubDComponentPtr)OVar3.m_ptr;
    }
    this_00->m_ptr = 0;
LAB_00623bc7:
    return (ON_SubDComponentPtr)this_00->m_ptr;
  }
  OVar3 = ON_SubDComponentPtr::Create(this->m_face_first);
LAB_00623bee:
  this_00->m_ptr = OVar3.m_ptr;
  return (ON_SubDComponentPtr)OVar3.m_ptr;
}

Assistant:

const class ON_SubDComponentPtr ON_SubDComponentIterator::NextComponent()
{
  switch (m_cptr_current.ComponentType())
  {
  case ON_SubDComponentPtr::Type::Vertex:
    {
      const ON_SubDVertex* vertex = ON_SUBD_VERTEX_POINTER(m_cptr_current.m_ptr);
      if (nullptr != vertex && vertex != m_vertex_last && nullptr != vertex->m_next_vertex)
      {
        m_cptr_current = ON_SubDComponentPtr::Create(vertex->m_next_vertex);
        return m_cptr_current;
      }
    }
    m_cptr_current = ON_SubDComponentPtr::Null;
    // no break here

  case ON_SubDComponentPtr::Type::Edge:
    {
      if (0 == m_cptr_current.m_ptr && nullptr != m_edge_first)
      {
        // switching from vertex to edge
        m_cptr_current = ON_SubDComponentPtr::Create(m_edge_first);
        return m_cptr_current;
      }
      const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(m_cptr_current.m_ptr);
      if (nullptr != edge && edge != m_edge_last && nullptr != edge->m_next_edge )
      {
        m_cptr_current = ON_SubDComponentPtr::Create(edge->m_next_edge);
        return m_cptr_current;
      }
    }
    m_cptr_current = ON_SubDComponentPtr::Null;
    // no break here

  case ON_SubDComponentPtr::Type::Face:
    {
      if (0 == m_cptr_current.m_ptr && nullptr != m_face_first)
      {
        // switching from edge to face
        m_cptr_current = ON_SubDComponentPtr::Create(m_face_first);
        return m_cptr_current;
      }
      const ON_SubDFace* face = ON_SUBD_FACE_POINTER(m_cptr_current.m_ptr);
      if (nullptr != face && face != m_face_last && nullptr != face->m_next_face)
      {
        m_cptr_current = ON_SubDComponentPtr::Create(face->m_next_face);
        return m_cptr_current;
      }
    }
    m_cptr_current = ON_SubDComponentPtr::Null;
    break;

  default:
    break;
  }
  
  return m_cptr_current;
}